

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void common_chat_templates_free(common_chat_templates *tmpls)

{
  chat_template *pcVar1;
  
  if (tmpls != (common_chat_templates *)0x0) {
    pcVar1 = (tmpls->template_tool_use)._M_t.
             super___uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_>
             ._M_t.
             super__Tuple_impl<0UL,_minja::chat_template_*,_std::default_delete<minja::chat_template>_>
             .super__Head_base<0UL,_minja::chat_template_*,_false>._M_head_impl;
    if (pcVar1 != (chat_template *)0x0) {
      std::default_delete<minja::chat_template>::operator()
                ((default_delete<minja::chat_template> *)&tmpls->template_tool_use,pcVar1);
    }
    (tmpls->template_tool_use)._M_t.
    super___uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_>._M_t.
    super__Tuple_impl<0UL,_minja::chat_template_*,_std::default_delete<minja::chat_template>_>.
    super__Head_base<0UL,_minja::chat_template_*,_false>._M_head_impl = (chat_template *)0x0;
    pcVar1 = (tmpls->template_default)._M_t.
             super___uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_>
             ._M_t.
             super__Tuple_impl<0UL,_minja::chat_template_*,_std::default_delete<minja::chat_template>_>
             .super__Head_base<0UL,_minja::chat_template_*,_false>._M_head_impl;
    if (pcVar1 != (chat_template *)0x0) {
      std::default_delete<minja::chat_template>::operator()
                ((default_delete<minja::chat_template> *)&tmpls->template_default,pcVar1);
    }
  }
  operator_delete(tmpls,0x18);
  return;
}

Assistant:

void common_chat_templates_free(struct common_chat_templates * tmpls) {
    delete tmpls;
}